

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_types.cpp
# Opt level: O3

void __thiscall
jaegertracing::sampling_manager::thrift::SamplingStrategyResponse::SamplingStrategyResponse
          (SamplingStrategyResponse *this,SamplingStrategyResponse *other15)

{
  _PerOperationSamplingStrategies__isset *p_Var1;
  double dVar2;
  
  *(undefined ***)this = &PTR__SamplingStrategyResponse_002686f8;
  *(undefined ***)&this->probabilisticSampling = &PTR__ProbabilisticSamplingStrategy_00268558;
  (this->probabilisticSampling).samplingRate = 0.0;
  *(undefined ***)&this->rateLimitingSampling = &PTR__RateLimitingSamplingStrategy_002685c0;
  (this->rateLimitingSampling).maxTracesPerSecond = 0;
  *(undefined ***)&this->operationSampling = &PTR__PerOperationSamplingStrategies_00268690;
  (this->operationSampling).defaultSamplingProbability = 0.0;
  (this->operationSampling).defaultLowerBoundTracesPerSecond = 0.0;
  (this->operationSampling).perOperationStrategies.
  super__Vector_base<jaegertracing::sampling_manager::thrift::OperationSamplingStrategy,_std::allocator<jaegertracing::sampling_manager::thrift::OperationSamplingStrategy>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->operationSampling).perOperationStrategies.
  super__Vector_base<jaegertracing::sampling_manager::thrift::OperationSamplingStrategy,_std::allocator<jaegertracing::sampling_manager::thrift::OperationSamplingStrategy>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->operationSampling).perOperationStrategies.
  super__Vector_base<jaegertracing::sampling_manager::thrift::OperationSamplingStrategy,_std::allocator<jaegertracing::sampling_manager::thrift::OperationSamplingStrategy>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->operationSampling).defaultUpperBoundTracesPerSecond = 0.0;
  p_Var1 = &(this->operationSampling).__isset;
  *p_Var1 = (_PerOperationSamplingStrategies__isset)((byte)*p_Var1 & 0xfe);
  this->__isset = (_SamplingStrategyResponse__isset)((byte)this->__isset & 0xf8);
  this->strategyType = other15->strategyType;
  (this->probabilisticSampling).samplingRate = (other15->probabilisticSampling).samplingRate;
  (this->rateLimitingSampling).maxTracesPerSecond =
       (other15->rateLimitingSampling).maxTracesPerSecond;
  dVar2 = (other15->operationSampling).defaultLowerBoundTracesPerSecond;
  (this->operationSampling).defaultSamplingProbability =
       (other15->operationSampling).defaultSamplingProbability;
  (this->operationSampling).defaultLowerBoundTracesPerSecond = dVar2;
  std::
  vector<jaegertracing::sampling_manager::thrift::OperationSamplingStrategy,_std::allocator<jaegertracing::sampling_manager::thrift::OperationSamplingStrategy>_>
  ::operator=(&(this->operationSampling).perOperationStrategies,
              &(other15->operationSampling).perOperationStrategies);
  (this->operationSampling).defaultUpperBoundTracesPerSecond =
       (other15->operationSampling).defaultUpperBoundTracesPerSecond;
  (this->operationSampling).__isset = (other15->operationSampling).__isset;
  this->__isset = other15->__isset;
  return;
}

Assistant:

SamplingStrategyResponse::SamplingStrategyResponse(const SamplingStrategyResponse& other15) {
  strategyType = other15.strategyType;
  probabilisticSampling = other15.probabilisticSampling;
  rateLimitingSampling = other15.rateLimitingSampling;
  operationSampling = other15.operationSampling;
  __isset = other15.__isset;
}